

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O0

int comex_fence_proc(int proc,comex_group_t group)

{
  int iVar1;
  comex_group_t in_ESI;
  int in_EDI;
  int world_proc;
  int ierr;
  int size;
  int *notify;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe4;
  int *piVar2;
  int in_stack_fffffffffffffff0;
  int local_8;
  
  piVar2 = (int *)0x0;
  iVar1 = comex_group_size(in_ESI,(int *)0x0);
  if (iVar1 != 0) {
    __assert_fail("COMEX_SUCCESS == ierr",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x448,"int comex_fence_proc(int, comex_group_t)");
  }
  if (in_EDI < 0) {
    __assert_fail("proc >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x448,"int comex_fence_proc(int, comex_group_t)");
  }
  if (in_stack_ffffffffffffffe4 <= in_EDI) {
    __assert_fail("proc < size",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x448,"int comex_fence_proc(int, comex_group_t)");
  }
  local_8 = in_EDI;
  if (in_ESI != 0) {
    comex_group_translate_world(in_ESI,in_stack_fffffffffffffff0,piVar2);
    local_8 = in_stack_ffffffffffffffdc;
  }
  if ((local_8 != l_state.rank) && (fence_array[local_8] != '\0')) {
    piVar2 = (int *)_my_malloc(CONCAT44(in_stack_ffffffffffffffe4,iVar1));
    *piVar2 = 1;
    _send_fence_message(in_stack_ffffffffffffffe4,
                        (int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    while (0 < *piVar2) {
      comex_make_progress();
    }
    fence_array[local_8] = '\0';
    _my_free((void *)0x1b5e58);
  }
  return 0;
}

Assistant:

int comex_fence_proc(int proc, comex_group_t group)
{
    int *notify = NULL;

    CHECK_GROUP(group,proc);
#if DEBUG
    printf("[%d] comex_fence_proc(proc=%d,group=$d)\n",
            l_state.rank, proc, group);
#endif

    /* Corner case */
    if (proc == l_state.rank) {
        return COMEX_SUCCESS;
    }

    /* are there outstanding put/acc requests to proc? */
    if (!fence_array[proc]) {
        return COMEX_SUCCESS;
    }

    /* we allocate the notifier on the heap in order to avoid reentry
     * into this function causing the same stack address to be reused */
    notify = _my_malloc(sizeof(int));
    *notify = 1;

    _send_fence_message(proc, notify);

    while (*notify > 0) {
        comex_make_progress();
    }

    fence_array[proc] = 0;

    _my_free(notify);

    return COMEX_SUCCESS;
}